

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_special_functions.cc
# Opt level: O1

void check_function<arg_res_tuple<float,3ul>,float>(arg_res_tuple<float,_3UL> *x_yref,float y)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  ostream *poVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  AssertionHandler catchAssertionHandler;
  ScopedMessage scopedMessage0;
  stringstream stream;
  StringRef local_2d8;
  char local_2c8 [16];
  float local_2b8;
  MessageBuilder local_2a8;
  float local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  undefined1 local_238 [16];
  SourceLineInfo local_220;
  StringRef local_210;
  SourceLineInfo local_200;
  ScopedMessage local_1f0;
  stringstream local_1a0 [16];
  long local_190;
  undefined8 local_188 [13];
  ios_base local_120 [264];
  
  fVar3 = x_yref->y;
  local_2b8 = y;
  std::__cxx11::stringstream::stringstream(local_1a0);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 7;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,"args: ",6);
  pbVar1 = operator<<((ostream *)&local_190,&x_yref->x);
  std::__ostream_insert<char,std::char_traits<char>>(pbVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(pbVar1,"lower bound: ",0xd);
  fVar5 = fVar3 * 0.99999714;
  local_238 = ZEXT416((uint)fVar5);
  fVar3 = fVar3 * 1.0000029;
  fVar4 = fVar3;
  if (fVar5 <= fVar3) {
    fVar4 = fVar5;
  }
  local_248 = (float)(-(uint)(ABS(fVar4) < 2.8211864e-37) & 0x82c00000 |
                     ~-(uint)(ABS(fVar4) < 2.8211864e-37) & (uint)fVar4);
  uStack_244 = 0;
  uStack_240 = 0;
  uStack_23c = 0;
  poVar2 = std::ostream::_M_insert<double>((double)local_248);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"upper bound: ",0xd);
  fVar4 = (float)local_238._0_4_;
  if ((float)local_238._0_4_ <= fVar3) {
    fVar4 = fVar3;
  }
  fVar3 = (float)(-(uint)(ABS(fVar4) < 2.8211864e-37) & 0x2c00000 |
                 ~-(uint)(ABS(fVar4) < 2.8211864e-37) & (uint)fVar4);
  poVar2 = std::ostream::_M_insert<double>((double)fVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"actual     : ",0xd);
  std::ostream::_M_insert<double>((double)local_2b8);
  local_220.file = "INFO";
  local_220.line = 4;
  local_200.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_special_functions.cc"
  ;
  local_200.line = 0x79;
  Catch::MessageBuilder::MessageBuilder(&local_2a8,(StringRef *)&local_220,&local_200,Info);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a8.super_MessageStream.m_stream.m_oss,local_2d8.m_start,
             local_2d8.m_size);
  Catch::ScopedMessage::ScopedMessage(&local_1f0,&local_2a8);
  if (local_2d8.m_start != local_2c8) {
    operator_delete(local_2d8.m_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.m_info.message._M_dataplus._M_p != &local_2a8.m_info.message.field_2) {
    operator_delete(local_2a8.m_info.message._M_dataplus._M_p);
  }
  Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_2a8);
  local_2d8.m_start = "REQUIRE";
  local_2d8.m_size = 7;
  local_220.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_special_functions.cc"
  ;
  local_220.line = 0x7a;
  Catch::StringRef::StringRef(&local_210,"(y_min <= y and y <= y_max)");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_2a8,&local_2d8,&local_220,local_210,Normal);
  local_2d8.m_start =
       (char *)(CONCAT71(local_2d8.m_start._1_7_,-(local_2b8 <= fVar3) & -(local_248 <= local_2b8))
               & 0xffffffffffffff01);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)&local_2a8,(ExprLhs<bool> *)&local_2d8);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_2a8);
  if (local_2a8.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_2a8.m_info.message.field_2._8_8_ + 0x70))();
  }
  Catch::ScopedMessage::~ScopedMessage(&local_1f0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void check_function(const T_ref &x_yref, const T y) {
  const T y_ref{x_yref.y};
  const std::tuple<T, T> y_min_max{bounds(y_ref)};
  const T y_min{std::get<0>(y_min_max)};
  const T y_max{std::get<1>(y_min_max)};
  std::stringstream stream;
  stream << std::setprecision(std::numeric_limits<T>::digits10 + 1)
         << "args: " << x_yref.x << "\n"
         << "lower bound: " << y_min << "\n"
         << "upper bound: " << y_max << "\n"
         << "actual     : " << y;
  INFO(stream.str());
  REQUIRE((y_min <= y and y <= y_max));
}